

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O2

QPDFExc * __thiscall
QPDF::damagedPDF(QPDFExc *__return_storage_ptr__,QPDF *this,string *object,string *message)

{
  qpdf_offset_t offset;
  
  offset = InputSource::getLastOffset
                     ((((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  damagedPDF(__return_storage_ptr__,this,object,offset,message);
  return __return_storage_ptr__;
}

Assistant:

QPDFExc
QPDF::damagedPDF(std::string const& object, std::string const& message)
{
    return damagedPDF(object, m->file->getLastOffset(), message);
}